

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileApprover.cpp
# Opt level: O1

int ApprovalTests::FileApprover::verify
              (EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t siglen_00;
  double __x;
  double extraout_XMM0_Qa;
  string receivedPath;
  string approvedPath;
  string local_e0;
  string local_c0;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  (**(code **)(*(long *)sig + 0x10))(local_40);
  (**(code **)(*(long *)ctx + 0x10))(&local_c0,ctx,local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  (**(code **)(*(long *)sig + 0x10))(local_60,sig);
  __x = (double)(**(code **)(*(long *)ctx + 0x18))(&local_e0,ctx,local_60);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
    __x = extraout_XMM0_Qa;
  }
  ApprovalFileLog::log(__x);
  SystemUtils::ensureParentDirectoryExists(&local_c0);
  SystemUtils::ensureParentDirectoryExists(&local_e0);
  local_80[0] = local_70;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,local_e0._M_dataplus._M_p,
             local_e0._M_dataplus._M_p + local_e0._M_string_length);
  (**(code **)(*(long *)sig + 0x18))(sig,local_80);
  siglen_00 = extraout_RDX;
  if (local_80[0] != local_70) {
    operator_delete(local_80[0]);
    siglen_00 = extraout_RDX_00;
  }
  verify((EVP_PKEY_CTX *)&local_e0,(uchar *)&local_c0,siglen_00,tbs,tbslen);
  local_a0[0] = local_90;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_a0,local_e0._M_dataplus._M_p,
             local_e0._M_dataplus._M_p + local_e0._M_string_length);
  (**(code **)(*(long *)sig + 0x20))(sig,local_a0);
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0]);
  }
  if (testPassedNotification_._16_8_ != 0) {
    (*(code *)testPassedNotification_._24_8_)(testPassedNotification_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    paVar1 = &local_c0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p);
      paVar1 = extraout_RAX;
    }
    return (int)paVar1;
  }
  ::std::__throw_bad_function_call();
}

Assistant:

void FileApprover::verify(const ApprovalNamer& n,
                              const ApprovalWriter& s,
                              const Reporter& r)
    {
        std::string const approvedPath = n.getApprovedFile(s.getFileExtensionWithDot());
        std::string const receivedPath = n.getReceivedFile(s.getFileExtensionWithDot());

        ApprovalFileLog::log(approvedPath);
        SystemUtils::ensureParentDirectoryExists(approvedPath);
        SystemUtils::ensureParentDirectoryExists(receivedPath);
        s.write(receivedPath);
        try
        {
            verify(receivedPath, approvedPath);
            s.cleanUpReceived(receivedPath);
            notifyTestPassed();
        }
        catch (const ApprovalException&)
        {
            // FailedFileLog::log(receivedPath, approvedPath);
            reportAfterTryingFrontLoadedReporter(receivedPath, approvedPath, r);
            throw;
        }
    }